

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::clipToEffectiveMask(QWidgetPrivate *this,QRegion *region)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  pointer pQVar2;
  QRegion *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *wd;
  QWidget *w;
  QWidget *q;
  QPoint offset;
  QWidget *in_stack_ffffffffffffffb0;
  QWidget *local_48;
  QWidget *p;
  QRegion local_20;
  QPoint local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = q_func(in_RDI);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  p = local_48;
  QPoint::QPoint((QPoint *)in_stack_ffffffffffffffb0);
  if ((in_RDI->graphicsEffect != (QGraphicsEffect *)0x0) &&
     (bVar1 = QWidget::isWindow(in_stack_ffffffffffffffb0), !bVar1)) {
    local_48 = QWidget::parentWidget((QWidget *)0x363a79);
    local_18 = QRect::topLeft((QRect *)in_RDI);
    QPoint::operator-=((QPoint *)in_stack_ffffffffffffffb0,(QPoint *)in_RDI);
  }
  while (local_48 != (QWidget *)0x0) {
    this_00 = QWidget::d_func((QWidget *)0x363abe);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x363ad1);
    if ((bVar1) &&
       (pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x363ae8),
       (*(ushort *)&pQVar2->field_0x7c >> 7 & 1) != 0)) {
      if (local_48 == p) {
        pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x363b3c);
        QRegion::QRegion(&local_20,(QRegion *)&pQVar2->mask);
      }
      else {
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x363b16);
        QRegion::translated(in_RSI,(QPoint *)p);
      }
      QRegion::operator&=(in_RSI,(QRegion *)&local_20);
      QRegion::~QRegion(&local_20);
    }
    bVar1 = QWidget::isWindow((QWidget *)this_00);
    if (bVar1) break;
    QRect::topLeft((QRect *)in_RDI);
    QPoint::operator-=((QPoint *)this_00,(QPoint *)in_RDI);
    local_48 = QWidget::parentWidget((QWidget *)0x363bab);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::clipToEffectiveMask(QRegion &region) const
{
    Q_Q(const QWidget);

    const QWidget *w = q;
    QPoint offset;

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && !w->isWindow()) {
        w = q->parentWidget();
        offset -= data.crect.topLeft();
    }
#endif // QT_CONFIG(graphicseffect)

    while (w) {
        const QWidgetPrivate *wd = w->d_func();
        if (wd->extra && wd->extra->hasMask)
            region &= (w != q) ? wd->extra->mask.translated(offset) : wd->extra->mask;
        if (w->isWindow())
            return;
        offset -= wd->data.crect.topLeft();
        w = w->parentWidget();
    }
}